

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O2

void __thiscall
Server::start(Server *this,
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *modules)

{
  pointer pbVar1;
  undefined8 extraout_RAX;
  pointer pbVar2;
  string local_40;
  
  do_socket(this);
  do_bind(this);
  do_listen(this);
  do_epoll(this);
  do_timer(this);
  pbVar1 = (modules->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  for (pbVar2 = (modules->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start; pbVar2 != pbVar1; pbVar2 = pbVar2 + 1) {
    std::__cxx11::string::string((string *)&local_40,(string *)pbVar2);
    load_module(this,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
  }
  do_udp(this);
  printf("Listen %s:%u\n",(this->server_addr)._M_dataplus._M_p,(ulong)this->port_no);
  event_loop(this,0x400);
  std::__cxx11::string::~string((string *)&local_40);
  _Unwind_Resume(extraout_RAX);
}

Assistant:

void Server::start(std::vector<std::string> modules) {
    this->do_socket();
    this->do_bind();
    this->do_listen();
    this->do_epoll();
    this->do_timer();
    for (auto &&module : modules) {
        this->load_module(module);
    }
    this->do_udp();
    printf("Listen %s:%u\n", this->server_addr.c_str(), this->port_no);
    this->event_loop(1024);
}